

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative.cpp
# Opt level: O0

string * fs_relative_to_abi_cxx11_
                   (string *__return_storage_ptr__,string_view base,string_view other)

{
  string_view path2;
  string_view path1;
  bool bVar1;
  string_view local_138;
  error_category *local_128;
  char *pcStack_120;
  char *local_118;
  char *pcStack_110;
  undefined4 local_fc;
  __sv_type local_f8;
  path local_d8;
  path local_b0;
  path local_88;
  undefined1 local_60 [8];
  string r;
  error_code ec;
  string_view other_local;
  string_view base_local;
  
  other_local._M_len = (size_t)other._M_str;
  ec._M_cat = (error_category *)other._M_len;
  other_local._M_str = (char *)base._M_len;
  std::error_code::error_code((error_code *)((long)&r.field_2 + 8));
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_b0,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_d8,(basic_string_view<char,_std::char_traits<char>_> *)&other_local._M_str,
             auto_format);
  std::filesystem::relative(&local_88,&local_b0,(error_code *)&local_d8);
  std::filesystem::__cxx11::path::generic_string((string *)local_60,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::~path(&local_d8);
  std::filesystem::__cxx11::path::~path(&local_b0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)((long)&r.field_2 + 8));
  if (bVar1) {
    local_118 = other_local._M_str;
    local_128 = ec._M_cat;
    pcStack_120 = (char *)other_local._M_len;
    pcStack_110 = base._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_138,"fs_relative_to");
    path1._M_str = pcStack_110;
    path1._M_len = (size_t)local_118;
    path2._M_str = pcStack_120;
    path2._M_len = (size_t)local_128;
    fs_print_error(path1,path2,local_138,(error_code *)((long)&r.field_2 + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    fs_drop_slash_abi_cxx11_(__return_storage_ptr__,local_f8);
  }
  local_fc = 1;
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_relative_to(std::string_view base, std::string_view other)
{
  // find relative path from base to other
  // "base" and "other" are treated as weakly canonical paths

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  std::string r = std::filesystem::relative(other, base, ec).generic_string();
  // this implements
  // std::filesystem::weakly_canonical(other, ec).lexically_relative(std::filesystem::weakly_canonical(base, ec)).generic_string();
  if(!ec)
    return fs_drop_slash(r);
#else
   ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(base, other, __func__, ec);
  return {};
}